

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pic.c
# Opt level: O2

void sysbvm_pic_flushSelector(sysbvm_pic_t *pic,sysbvm_tuple_t selector)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = sysbvm_pic_writeLock(pic);
  for (lVar3 = 8; lVar3 != 0x68; lVar3 = lVar3 + 0x18) {
    if (*(sysbvm_tuple_t *)((long)pic->entries + lVar3 + -8) == selector) {
      puVar1 = (undefined8 *)((long)pic->entries + lVar3 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
    }
  }
  pic->postSequence = uVar2;
  return;
}

Assistant:

SYSBVM_API void sysbvm_pic_flushSelector(sysbvm_pic_t *pic, sysbvm_tuple_t selector)
{
    uint32_t sequence = sysbvm_pic_writeLock(pic);
    for(int i = 0; i < SYSBVM_PIC_ENTRY_COUNT; ++i)
    {
        sysbvm_picEntry_t *entry = pic->entries + i;
        if(entry->selector == selector)
            memset(entry, 0, sizeof(sysbvm_picEntry_t));
    }
    sysbvm_pic_writeUnlock(pic, sequence);
}